

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::SetLanguageEnabledMaps(cmGlobalGenerator *this,string *l,cmMakefile *mf)

{
  string_view arg;
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  mapped_type_conflict1 *pmVar5;
  mapped_type *pmVar6;
  string *psVar7;
  reference __k;
  mapped_type_conflict *pmVar8;
  string *i;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_298 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensionList;
  string ignoreExts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  allocator<char> local_211;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  undefined1 local_1d0 [8];
  string ignoreExtensionsVar;
  string_view local_190;
  string_view local_180;
  undefined1 local_170 [8];
  string outputExtension;
  cmValue p;
  undefined1 local_128 [8];
  string outputExtensionVar;
  cmAlphaNum local_d8;
  undefined1 local_a8 [8];
  string msg;
  int local_7c;
  cmValue cStack_78;
  int preference;
  cmValue linkerPref;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string linkerPrefVar;
  cmMakefile *mf_local;
  string *l_local;
  cmGlobalGenerator *this_local;
  
  linkerPrefVar.field_2._8_8_ = mf;
  bVar1 = ::cm::
          contains<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&this->LanguageToLinkerPreference,l);
  if (!bVar1) {
    std::operator+(&local_60,"CMAKE_",l);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_60,"_LINKER_PREFERENCE");
    std::__cxx11::string::~string((string *)&local_60);
    msg.field_2._8_8_ =
         (size_type)cmMakefile::GetDefinition(linkerPrefVar.field_2._8_8_,(string *)local_40);
    local_7c = 0;
    cStack_78 = (cmValue)msg.field_2._8_8_;
    bVar1 = cmNonempty((cmValue)msg.field_2._8_8_);
    if (bVar1) {
      cmValue::operator->[abi_cxx11_(&stack0xffffffffffffff88);
      uVar3 = std::__cxx11::string::c_str();
      iVar2 = __isoc99_sscanf(uVar3,"%d",&local_7c);
      if (iVar2 != 1) {
        psVar7 = cmValue::operator*[abi_cxx11_(&stack0xffffffffffffff88);
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psVar7);
        if (*pcVar4 == 'P') {
          local_7c = 100;
        }
        else {
          local_7c = 0;
        }
      }
    }
    if (local_7c < 0) {
      cmAlphaNum::cmAlphaNum(&local_d8,(string *)local_40);
      cmAlphaNum::cmAlphaNum
                ((cmAlphaNum *)((long)&outputExtensionVar.field_2 + 8),
                 " is negative, adjusting it to 0");
      cmStrCat<>((string *)local_a8,&local_d8,(cmAlphaNum *)((long)&outputExtensionVar.field_2 + 8))
      ;
      cmSystemTools::Message((string *)local_a8,"Warning");
      local_7c = 0;
      std::__cxx11::string::~string((string *)local_a8);
    }
    iVar2 = local_7c;
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&this->LanguageToLinkerPreference,l);
    *pmVar5 = iVar2;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,"CMAKE_",
                   l);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                   "_OUTPUT_EXTENSION");
    std::__cxx11::string::~string((string *)&p);
    outputExtension.field_2._8_8_ =
         (size_type)cmMakefile::GetDefinition(linkerPrefVar.field_2._8_8_,(string *)local_128);
    bVar1 = cmValue::operator_cast_to_bool((cmValue *)((long)&outputExtension.field_2 + 8));
    if (bVar1) {
      psVar7 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&outputExtension.field_2 + 8));
      std::__cxx11::string::string((string *)local_170,(string *)psVar7);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->LanguageToOutputExtension,l);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)local_170);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->OutputExtensions,(key_type *)local_170);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)local_170);
      local_180 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_170);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_190,".");
      bVar1 = cmHasPrefix(local_180,local_190);
      if (bVar1) {
        std::__cxx11::string::substr
                  ((ulong)((long)&ignoreExtensionsVar.field_2 + 8),(ulong)local_170);
        std::__cxx11::string::operator=
                  ((string *)local_170,(string *)(ignoreExtensionsVar.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(ignoreExtensionsVar.field_2._M_local_buf + 8));
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->OutputExtensions,(key_type *)local_170);
        std::__cxx11::string::operator=((string *)pmVar6,(string *)local_170);
      }
      std::__cxx11::string::~string((string *)local_170);
    }
    FillExtensionToLanguageMap(this,l,(cmMakefile *)linkerPrefVar.field_2._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"CMAKE_",&local_211);
    std::__cxx11::string::string((string *)&local_238,(string *)l);
    std::operator+(&local_1f0,&local_210,&local_238);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"_IGNORE_EXTENSIONS",
               (allocator<char> *)(ignoreExts.field_2._M_local_buf + 0xf));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                   &local_1f0,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator((allocator<char> *)(ignoreExts.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator(&local_211);
    psVar7 = cmMakefile::GetSafeDefinition
                       ((cmMakefile *)linkerPrefVar.field_2._8_8_,(string *)local_1d0);
    std::__cxx11::string::string
              ((string *)
               &extensionList.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)psVar7);
    arg = (string_view)
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)
                     &extensionList.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_298,arg,false);
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_298);
    i = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_298);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&i);
      if (!bVar1) break;
      __k = __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end1);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               ::operator[](&this->IgnoreExtensions,__k);
      *pmVar8 = true;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_298);
    std::__cxx11::string::~string
              ((string *)
               &extensionList.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)local_1d0);
    std::__cxx11::string::~string((string *)local_128);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void cmGlobalGenerator::SetLanguageEnabledMaps(const std::string& l,
                                               cmMakefile* mf)
{
  // use LanguageToLinkerPreference to detect whether this functions has
  // run before
  if (cm::contains(this->LanguageToLinkerPreference, l)) {
    return;
  }

  std::string linkerPrefVar = "CMAKE_" + l + "_LINKER_PREFERENCE";
  cmValue linkerPref = mf->GetDefinition(linkerPrefVar);
  int preference = 0;
  if (cmNonempty(linkerPref)) {
    if (sscanf(linkerPref->c_str(), "%d", &preference) != 1) {
      // backward compatibility: before 2.6 LINKER_PREFERENCE
      // was either "None" or "Preferred", and only the first character was
      // tested. So if there is a custom language out there and it is
      // "Preferred", set its preference high
      if ((*linkerPref)[0] == 'P') {
        preference = 100;
      } else {
        preference = 0;
      }
    }
  }

  if (preference < 0) {
    std::string msg =
      cmStrCat(linkerPrefVar, " is negative, adjusting it to 0");
    cmSystemTools::Message(msg, "Warning");
    preference = 0;
  }

  this->LanguageToLinkerPreference[l] = preference;

  std::string outputExtensionVar = "CMAKE_" + l + "_OUTPUT_EXTENSION";
  if (cmValue p = mf->GetDefinition(outputExtensionVar)) {
    std::string outputExtension = *p;
    this->LanguageToOutputExtension[l] = outputExtension;
    this->OutputExtensions[outputExtension] = outputExtension;
    if (cmHasPrefix(outputExtension, ".")) {
      outputExtension = outputExtension.substr(1);
      this->OutputExtensions[outputExtension] = outputExtension;
    }
  }

  // The map was originally filled by SetLanguageEnabledFlag, but
  // since then the compiler- and platform-specific files have been
  // loaded which might have added more entries.
  this->FillExtensionToLanguageMap(l, mf);

  std::string ignoreExtensionsVar =
    std::string("CMAKE_") + std::string(l) + std::string("_IGNORE_EXTENSIONS");
  std::string ignoreExts = mf->GetSafeDefinition(ignoreExtensionsVar);
  std::vector<std::string> extensionList = cmExpandedList(ignoreExts);
  for (std::string const& i : extensionList) {
    this->IgnoreExtensions[i] = true;
  }
}